

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl2.cpp
# Opt level: O2

void ImGui_ImplOpenGL2_RenderDrawData(ImDrawData *draw_data)

{
  undefined4 uVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  undefined4 uVar4;
  ImDrawList *this;
  ImDrawVert *pIVar5;
  ImDrawCallback p_Var6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar9;
  undefined4 fb_width;
  undefined4 fb_height;
  uint uVar10;
  ImDrawCmd *pIVar11;
  long lVar12;
  undefined4 uVar13;
  unsigned_short *puVar14;
  int cmd_i;
  int i;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  GLint last_tex_env_mode;
  GLint last_shade_model;
  GLint last_texture;
  undefined1 local_d8 [16];
  GLint last_polygon_mode [2];
  GLint last_scissor_box [4];
  GLint last_viewport [4];
  float local_88;
  float fStack_84;
  float local_78;
  float local_68;
  float local_58;
  
  local_d8._0_4_ = (undefined4)((draw_data->DisplaySize).x * (draw_data->FramebufferScale).x);
  local_d8._4_4_ = (undefined4)((draw_data->DisplaySize).y * (draw_data->FramebufferScale).y);
  local_d8._8_8_ = 0;
  auVar16 = vpcmpeqd_avx(local_d8,ZEXT416(0) << 0x20);
  auVar16 = vpmovsxdq_avx(auVar16);
  if ((auVar16 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0 && -1 < auVar16[0xf]) {
    glGetIntegerv(0x8069,&last_texture);
    glGetIntegerv(0xb40,last_polygon_mode);
    glGetIntegerv(0xba2,last_viewport);
    glGetIntegerv(0xc10,last_scissor_box);
    glGetIntegerv(0xb54,&last_shade_model);
    glGetTexEnviv(0x2300,0x2200,&last_tex_env_mode);
    glPushAttrib(0x7000);
    fb_width = local_d8._0_4_;
    fb_height = local_d8._4_4_;
    ImGui_ImplOpenGL2_SetupRenderState(draw_data,local_d8._0_4_,local_d8._4_4_);
    IVar2 = draw_data->DisplayPos;
    auVar15._8_8_ = 0;
    auVar15._0_4_ = IVar2.x;
    auVar15._4_4_ = IVar2.y;
    IVar3 = draw_data->FramebufferScale;
    auVar16._8_8_ = 0;
    auVar16._0_4_ = IVar3.x;
    auVar16._4_4_ = IVar3.y;
    auVar7 = vmovshdup_avx(auVar15);
    auVar8 = vmovshdup_avx(auVar16);
    auVar16 = vcvtdq2ps_avx(local_d8);
    auVar17 = vshufps_avx(local_d8,local_d8,0x55);
    local_d8 = vcvtdq2ps_avx(auVar17);
    for (lVar12 = 0; lVar12 < draw_data->CmdListsCount; lVar12 = lVar12 + 1) {
      this = draw_data->CmdLists[lVar12];
      puVar14 = (this->IdxBuffer).Data;
      pIVar5 = (this->VtxBuffer).Data;
      glVertexPointer(2,0x1406,0x14,pIVar5);
      glTexCoordPointer(2,0x1406,0x14,&pIVar5->uv);
      glColorPointer(4,0x1401,0x14,&pIVar5->col);
      for (i = 0; i < (this->CmdBuffer).Size; i = i + 1) {
        uVar13 = 0;
        pIVar11 = ImVector<ImDrawCmd>::operator[](&this->CmdBuffer,i);
        p_Var6 = pIVar11->UserCallback;
        if (p_Var6 == (ImDrawCallback)0x0) {
          local_78 = IVar2.x;
          local_88 = IVar3.x;
          fVar9 = ((pIVar11->ClipRect).x - local_78) * local_88;
          if (fVar9 < auVar16._0_4_) {
            local_58 = auVar7._0_4_;
            local_68 = auVar8._0_4_;
            local_68 = ((pIVar11->ClipRect).y - local_58) * local_68;
            if (local_68 < local_d8._0_4_) {
              uVar1 = (pIVar11->ClipRect).z;
              uVar4 = (pIVar11->ClipRect).w;
              auVar17._4_4_ = uVar4;
              auVar17._0_4_ = uVar1;
              auVar17._8_8_ = 0;
              auVar17 = vsubps_avx(auVar17,auVar15);
              fStack_84 = IVar3.y;
              auVar18._0_4_ = auVar17._0_4_ * local_88;
              auVar18._4_4_ = auVar17._4_4_ * fStack_84;
              auVar18._8_4_ = auVar17._8_4_ * 0.0;
              auVar18._12_4_ = auVar17._12_4_ * 0.0;
              auVar17 = vcmpps_avx(ZEXT816(0) << 0x40,auVar18,2);
              auVar17 = vshufps_avx(auVar17,auVar17,0x50);
              uVar10 = vmovmskpd_avx(auVar17);
              if (((uVar10 & 1) != 0) && ((byte)((byte)uVar10 >> 1) != 0)) {
                auVar17 = vmovshdup_avx(auVar18);
                glScissor((int)fVar9,CONCAT44(uVar13,(int)(local_d8._0_4_ - auVar17._0_4_)),
                          (int)(auVar18._0_4_ - fVar9),(int)(auVar17._0_4_ - local_68));
                glBindTexture(0xde1,*(undefined4 *)&pIVar11->TextureId);
                glDrawElements(4,pIVar11->ElemCount,0x1403,puVar14);
              }
            }
          }
        }
        else if (p_Var6 == (ImDrawCallback)0xffffffffffffffff) {
          ImGui_ImplOpenGL2_SetupRenderState(draw_data,fb_width,fb_height);
        }
        else {
          (*p_Var6)(this,pIVar11);
        }
        puVar14 = puVar14 + pIVar11->ElemCount;
      }
    }
    glDisableClientState(0x8076);
    glDisableClientState(0x8078);
    glDisableClientState(0x8074);
    glBindTexture(0xde1,last_texture);
    glMatrixMode(0x1700);
    glPopMatrix();
    glMatrixMode(0x1701);
    glPopMatrix();
    glPopAttrib();
    glPolygonMode(0x404,last_polygon_mode[0]);
    glPolygonMode(0x405,last_polygon_mode[1]);
    glViewport(last_viewport[0],last_viewport[1],last_viewport[2],last_viewport[3]);
    glScissor(last_scissor_box[0],last_scissor_box[1],last_scissor_box[2],last_scissor_box[3]);
    glShadeModel(last_shade_model);
    glTexEnvi(0x2300,0x2200,last_tex_env_mode);
  }
  return;
}

Assistant:

void ImGui_ImplOpenGL2_RenderDrawData(ImDrawData* draw_data)
{
    // Avoid rendering when minimized, scale coordinates for retina displays (screen coordinates != framebuffer coordinates)
    int fb_width = (int)(draw_data->DisplaySize.x * draw_data->FramebufferScale.x);
    int fb_height = (int)(draw_data->DisplaySize.y * draw_data->FramebufferScale.y);
    if (fb_width == 0 || fb_height == 0)
        return;

    // Backup GL state
    GLint last_texture; glGetIntegerv(GL_TEXTURE_BINDING_2D, &last_texture);
    GLint last_polygon_mode[2]; glGetIntegerv(GL_POLYGON_MODE, last_polygon_mode);
    GLint last_viewport[4]; glGetIntegerv(GL_VIEWPORT, last_viewport);
    GLint last_scissor_box[4]; glGetIntegerv(GL_SCISSOR_BOX, last_scissor_box);
    GLint last_shade_model; glGetIntegerv(GL_SHADE_MODEL, &last_shade_model);
    GLint last_tex_env_mode; glGetTexEnviv(GL_TEXTURE_ENV, GL_TEXTURE_ENV_MODE, &last_tex_env_mode);
    glPushAttrib(GL_ENABLE_BIT | GL_COLOR_BUFFER_BIT | GL_TRANSFORM_BIT);

    // Setup desired GL state
    ImGui_ImplOpenGL2_SetupRenderState(draw_data, fb_width, fb_height);

    // Will project scissor/clipping rectangles into framebuffer space
    ImVec2 clip_off = draw_data->DisplayPos;         // (0,0) unless using multi-viewports
    ImVec2 clip_scale = draw_data->FramebufferScale; // (1,1) unless using retina display which are often (2,2)

    // Render command lists
    for (int n = 0; n < draw_data->CmdListsCount; n++)
    {
        const ImDrawList* cmd_list = draw_data->CmdLists[n];
        const ImDrawVert* vtx_buffer = cmd_list->VtxBuffer.Data;
        const ImDrawIdx* idx_buffer = cmd_list->IdxBuffer.Data;
        glVertexPointer(2, GL_FLOAT, sizeof(ImDrawVert), (const GLvoid*)((const char*)vtx_buffer + IM_OFFSETOF(ImDrawVert, pos)));
        glTexCoordPointer(2, GL_FLOAT, sizeof(ImDrawVert), (const GLvoid*)((const char*)vtx_buffer + IM_OFFSETOF(ImDrawVert, uv)));
        glColorPointer(4, GL_UNSIGNED_BYTE, sizeof(ImDrawVert), (const GLvoid*)((const char*)vtx_buffer + IM_OFFSETOF(ImDrawVert, col)));

        for (int cmd_i = 0; cmd_i < cmd_list->CmdBuffer.Size; cmd_i++)
        {
            const ImDrawCmd* pcmd = &cmd_list->CmdBuffer[cmd_i];
            if (pcmd->UserCallback)
            {
                // User callback, registered via ImDrawList::AddCallback()
                // (ImDrawCallback_ResetRenderState is a special callback value used by the user to request the renderer to reset render state.)
                if (pcmd->UserCallback == ImDrawCallback_ResetRenderState)
                    ImGui_ImplOpenGL2_SetupRenderState(draw_data, fb_width, fb_height);
                else
                    pcmd->UserCallback(cmd_list, pcmd);
            }
            else
            {
                // Project scissor/clipping rectangles into framebuffer space
                ImVec4 clip_rect;
                clip_rect.x = (pcmd->ClipRect.x - clip_off.x) * clip_scale.x;
                clip_rect.y = (pcmd->ClipRect.y - clip_off.y) * clip_scale.y;
                clip_rect.z = (pcmd->ClipRect.z - clip_off.x) * clip_scale.x;
                clip_rect.w = (pcmd->ClipRect.w - clip_off.y) * clip_scale.y;

                if (clip_rect.x < fb_width && clip_rect.y < fb_height && clip_rect.z >= 0.0f && clip_rect.w >= 0.0f)
                {
                    // Apply scissor/clipping rectangle
                    glScissor((int)clip_rect.x, (int)(fb_height - clip_rect.w), (int)(clip_rect.z - clip_rect.x), (int)(clip_rect.w - clip_rect.y));

                    // Bind texture, Draw
                    glBindTexture(GL_TEXTURE_2D, (GLuint)(intptr_t)pcmd->TextureId);
                    glDrawElements(GL_TRIANGLES, (GLsizei)pcmd->ElemCount, sizeof(ImDrawIdx) == 2 ? GL_UNSIGNED_SHORT : GL_UNSIGNED_INT, idx_buffer);
                }
            }
            idx_buffer += pcmd->ElemCount;
        }
    }

    // Restore modified GL state
    glDisableClientState(GL_COLOR_ARRAY);
    glDisableClientState(GL_TEXTURE_COORD_ARRAY);
    glDisableClientState(GL_VERTEX_ARRAY);
    glBindTexture(GL_TEXTURE_2D, (GLuint)last_texture);
    glMatrixMode(GL_MODELVIEW);
    glPopMatrix();
    glMatrixMode(GL_PROJECTION);
    glPopMatrix();
    glPopAttrib();
    glPolygonMode(GL_FRONT, (GLenum)last_polygon_mode[0]); glPolygonMode(GL_BACK, (GLenum)last_polygon_mode[1]);
    glViewport(last_viewport[0], last_viewport[1], (GLsizei)last_viewport[2], (GLsizei)last_viewport[3]);
    glScissor(last_scissor_box[0], last_scissor_box[1], (GLsizei)last_scissor_box[2], (GLsizei)last_scissor_box[3]);
    glShadeModel(last_shade_model);
    glTexEnvi(GL_TEXTURE_ENV, GL_TEXTURE_ENV_MODE, last_tex_env_mode);
}